

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O2

string * __thiscall
arc::to_string_abi_cxx11_(string *__return_storage_ptr__,arc *this,atom *a,int write)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>
  *puVar4;
  ostream *poVar5;
  variant_alternative_t<9UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pvVar6;
  variant_alternative_t<3UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pvVar7;
  size_t sVar8;
  atom *paVar9;
  closure *pcVar10;
  closure *pcVar11;
  uint *puVar12;
  int iVar13;
  _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  *this_00;
  __node_base *p_Var14;
  undefined1 local_418 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string local_398;
  atom local_378;
  atom local_358;
  atom local_338;
  atom local_318;
  atom local_2f8;
  atom local_2d8;
  atom local_2b8;
  atom local_298;
  atom local_278;
  atom local_258;
  atom local_238;
  atom local_218;
  atom local_1f8;
  stringstream ss;
  undefined1 local_1d0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [23];
  atom local_50;
  
  iVar13 = (int)a;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar12 = &switchD_00123206::switchdataD_00130088;
  iVar3 = 0x130088;
  switch(*(undefined4 *)this) {
  case 0:
    break;
  case 1:
    atom::atom(&local_378,(atom *)this);
    iVar3 = listp(&local_378);
    if (iVar3 == 0) {
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&local_378.val);
    }
    else {
      atom::atom(&local_238,(atom *)this);
      sVar8 = len(&local_238);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&local_238.val);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&local_378.val);
      if (sVar8 == 2) {
        paVar9 = car((atom *)this);
        bVar2 = is(paVar9,(atom *)sym_quote);
        iVar3 = (int)puVar12;
        if (bVar2) {
          paVar9 = cdr((atom *)this);
          paVar9 = car(paVar9);
          atom::atom(&local_258,paVar9);
          to_string_abi_cxx11_
                    ((string *)local_418,(arc *)&local_258,(atom *)((ulong)a & 0xffffffff),iVar3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         "\'",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_418);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)local_418);
          this_00 = (_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                     *)&local_258.val;
          goto LAB_0012382d;
        }
        paVar9 = car((atom *)this);
        bVar2 = is(paVar9,(atom *)sym_quasiquote);
        iVar3 = (int)puVar12;
        if (bVar2) {
          paVar9 = cdr((atom *)this);
          paVar9 = car(paVar9);
          atom::atom(&local_278,paVar9);
          to_string_abi_cxx11_
                    ((string *)local_418,(arc *)&local_278,(atom *)((ulong)a & 0xffffffff),iVar3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         "`",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_418);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)local_418);
          this_00 = (_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                     *)&local_278.val;
          goto LAB_0012382d;
        }
        paVar9 = car((atom *)this);
        bVar2 = is(paVar9,(atom *)sym_unquote);
        iVar3 = (int)puVar12;
        if (bVar2) {
          paVar9 = cdr((atom *)this);
          paVar9 = car(paVar9);
          atom::atom(&local_298,paVar9);
          to_string_abi_cxx11_
                    ((string *)local_418,(arc *)&local_298,(atom *)((ulong)a & 0xffffffff),iVar3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         ",",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_418);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)local_418);
          this_00 = (_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                     *)&local_298.val;
          goto LAB_0012382d;
        }
        paVar9 = car((atom *)this);
        bVar2 = is(paVar9,(atom *)sym_unquote_splicing);
        iVar3 = (int)puVar12;
        if (bVar2) {
          paVar9 = cdr((atom *)this);
          paVar9 = car(paVar9);
          atom::atom(&local_2b8,paVar9);
          to_string_abi_cxx11_
                    ((string *)local_418,(arc *)&local_2b8,(atom *)((ulong)a & 0xffffffff),iVar3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         ",@",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_418);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)local_418);
          this_00 = (_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                     *)&local_2b8.val;
          goto LAB_0012382d;
        }
      }
    }
    paVar9 = car((atom *)this);
    atom::atom(&local_2d8,paVar9);
    to_string_abi_cxx11_
              ((string *)local_418,(arc *)&local_2d8,(atom *)((ulong)a & 0xffffffff),(int)puVar12);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,"(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::~string((string *)local_418);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)&local_2d8.val);
    paVar9 = cdr((atom *)this);
    atom::operator=((atom *)this,paVar9);
    while( true ) {
      iVar3 = (int)puVar12;
      if (*(int *)this != 1) break;
      paVar9 = car((atom *)this);
      atom::atom(&local_50,paVar9);
      to_string_abi_cxx11_
                ((string *)local_418,(arc *)&local_50,(atom *)((ulong)a & 0xffffffff),(int)puVar12);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss," ",
                     (string *)local_418);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::~string((string *)local_418);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&local_50.val);
      paVar9 = cdr((atom *)this);
      atom::operator=((atom *)this,paVar9);
    }
    if (*(int *)this != 0) {
      atom::atom(&local_2f8,(atom *)this);
      to_string_abi_cxx11_
                ((string *)local_418,(arc *)&local_2f8,(atom *)((ulong)a & 0xffffffff),iVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss," . ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418)
      ;
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::~string((string *)local_418);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&local_2f8.val);
    }
    goto LAB_00123a43;
  case 2:
    std::
    get<2ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
              ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                *)(this + 8));
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  case 3:
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    *(undefined8 *)(local_1d0 + *(long *)(local_1c8[0]._M_allocated_capacity - 0x18) + 0x10) = 0x10;
    pvVar7 = std::
             get<3ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                       ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)(this + 8));
    std::ostream::_M_insert<double>(*pvVar7);
    std::__cxx11::stringbuf::str();
    goto LAB_001234a3;
  case 4:
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar5 = std::operator<<((ostream *)(local_1d0 + 8),"#<builtin:");
    std::
    get<4ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
              ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                *)(this + 8));
    poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
    std::operator<<(poVar5,">");
    std::__cxx11::stringbuf::str();
LAB_001234a3:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_418);
    std::__cxx11::string::~string((string *)local_418);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return __return_storage_ptr__;
  case 5:
    pcVar11 = atom::asp<arc::closure>((atom *)this);
    pcVar10 = atom::asp<arc::closure>((atom *)this);
    make_cons((atom *)local_418,&pcVar11->args,&pcVar10->body);
    make_cons((atom *)&ss,(atom *)sym_fn,(atom *)local_418);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)(local_418 + 8));
    atom::atom(&local_318,(atom *)&ss);
    to_string_abi_cxx11_(&local_3f8,(arc *)&local_318,(atom *)0x1,iVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                   "#<closure>",&local_3f8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_418);
    std::__cxx11::string::~string((string *)local_418);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)&local_318.val);
    this_00 = (_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
               *)local_1d0;
    goto LAB_0012382d;
  case 6:
    pcVar11 = atom::asp<arc::closure>((atom *)this);
    atom::atom(&local_338,&pcVar11->args);
    to_string_abi_cxx11_(&local_398,(arc *)&local_338,(atom *)((ulong)a & 0xffffffff),iVar3);
    std::operator+(&local_3b8,"#<macro:",&local_398);
    std::operator+(&local_3f8,&local_3b8," ");
    pcVar11 = atom::asp<arc::closure>((atom *)this);
    atom::atom(&local_358,&pcVar11->body);
    to_string_abi_cxx11_(&local_3d8,(arc *)&local_358,(atom *)((ulong)a & 0xffffffff),iVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                   &local_3f8,&local_3d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                   ">");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::~string((string *)local_418);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)&local_358.val);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_398);
    this_00 = (_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
               *)&local_338.val;
LAB_0012382d:
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    ::~_Variant_storage(this_00);
    return __return_storage_ptr__;
  case 7:
    if (iVar13 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    atom::asp<std::__cxx11::string>((atom *)this);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    if (iVar13 == 0) {
      return __return_storage_ptr__;
    }
    goto LAB_00123a43;
  case 8:
    break;
  case 9:
    break;
  case 10:
    break;
  case 0xb:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    puVar4 = atom::
             asp<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>
                       ((atom *)this);
    p_Var14 = &(puVar4->_M_h)._M_before_begin;
    while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
      atom::atom(&local_1f8,(atom *)(p_Var14 + 1));
      to_string_abi_cxx11_
                (&local_398,(arc *)&local_1f8,(atom *)((ulong)a & 0xffffffff),(int)puVar12);
      std::operator+(&local_3b8,"(",&local_398);
      std::operator+(&local_3f8,&local_3b8," . ");
      atom::atom(&local_218,(atom *)(p_Var14 + 5));
      to_string_abi_cxx11_
                (&local_3d8,(arc *)&local_218,(atom *)((ulong)a & 0xffffffff),(int)puVar12);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                     &local_3f8,&local_3d8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,
                     ")");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::~string((string *)local_418);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&local_218.val);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_398);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)&local_1f8.val);
    }
    goto LAB_00123a43;
  case 0xc:
    if (iVar13 == 0) {
      pvVar6 = std::
               get<9ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                         ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           *)(this + 8));
      *(__return_storage_ptr__->_M_dataplus)._M_p = *pvVar6;
      (__return_storage_ptr__->_M_dataplus)._M_p[1] = '\0';
      return __return_storage_ptr__;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pvVar6 = std::
             get<9ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                       ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)(this + 8));
    cVar1 = *pvVar6;
    if ((((cVar1 != '\0') && (cVar1 != '\t')) && (cVar1 != '\n')) &&
       ((cVar1 != ' ' && (cVar1 != '\r')))) {
      std::
      get<9ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                ((variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                  *)(this + 8));
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
LAB_00123a43:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  case 0xd:
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string to_string(atom a, int write) {
		string s;
		switch (a.type) {
		case T_NIL:
			s = "nil";
			break;
		case T_CONS: {
			if (listp(a) && len(a) == 2) {
				if (is(car(a), sym_quote)) {
					s = "'" + to_string(car(cdr(a)), write);
					break;
				}
				else if (is(car(a), sym_quasiquote)) {
					s = "`" + to_string(car(cdr(a)), write);
					break;
				}
				else if (is(car(a), sym_unquote)) {
					s = "," + to_string(car(cdr(a)), write);
					break;
				}
				else if (is(car(a), sym_unquote_splicing)) {
					s = ",@" + to_string(car(cdr(a)), write);
					break;
				}
			}
			s = "(" + to_string(car(a), write);
			a = cdr(a);
			while (!no(a)) {
				if (a.type == T_CONS) {
					s += " " + to_string(car(a), write);
					a = cdr(a);
				}
				else {
					s += " . " + to_string(a, write);
					break;
				}
			}
			s += ")";
			break;
		}
		case T_SYM:
			s = *get<sym>(a.val);
			break;
		case T_STRING:
			if (write) s += "\"";
			s += a.asp<string>();
			if (write) s += "\"";
			break;
		case T_NUM:
		{
			stringstream ss;
			ss << setprecision(16) << get<double>(a.val);
			s = ss.str();
			break;
		}
		case T_BUILTIN:
		{
			stringstream ss;
			ss << "#<builtin:" << (void*)get<builtin>(a.val) << ">";
			s = ss.str();
			break;
		}
		case T_CLOSURE:
		{
			atom a2 = make_cons(sym_fn, make_cons(a.asp<struct closure>().args, a.asp<struct closure>().body));
			s = "#<closure>" + to_string(a2, 1);
			break;
		}
		case T_MACRO:
			s = "#<macro:" + to_string(a.asp<struct closure>().args, write) +
				" " + to_string(a.asp<struct closure>().body, write) + ">";
			break;
		case T_INPUT:
			s = "#<input>";
			break;
		case T_INPUT_PIPE:
			s = "#<input-pipe>";
			break;
		case T_OUTPUT:
			s = "#<output>";
			break;
		case T_TABLE: {
			s += "#<table:(";
			for (auto& p : a.asp<table>()) {
				s += "(" + to_string(p.first, write) + " . " + to_string(p.second, write) + ")";
			}
			s += ")>";
			break; }
		case T_CHAR:
			if (write) {
				s += "#\\";
				switch (get<char>(a.val)) {
				case '\0': s += "nul"; break;
				case '\r': s += "return"; break;
				case '\n': s += "newline"; break;
				case '\t': s += "tab"; break;
				case ' ': s += "space"; break;
				default:
					s += get<char>(a.val);
				}
			}
			else {
				s[0] = get<char>(a.val);
				s[1] = '\0';
			}
			break;
		case T_CONTINUATION:
			s = "#<continuation>";
			break;
		default:
			s = "#<unknown type>";
			break;
		}
		return s;
	}